

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

numeric * __thiscall cs::numeric::operator/(numeric *this,numeric *rhs)

{
  uint8_t uVar1;
  longdouble *in_RDX;
  longdouble *in_RSI;
  numeric *in_RDI;
  long local_60;
  longdouble local_58;
  longdouble local_48;
  longdouble local_38;
  longdouble local_28;
  longdouble *local_18;
  
  local_18 = in_RDX;
  uVar1 = get_composite_type((bool)(*(byte *)(in_RSI + 1) & 1),(bool)(*(byte *)(in_RDX + 1) & 1));
  switch(uVar1) {
  default:
    local_28 = *in_RSI / *local_18;
    numeric<long_double>(in_RDI,&local_28);
    break;
  case '\x01':
    local_38 = *in_RSI / (longdouble)*(long *)local_18;
    numeric<long_double>(in_RDI,&local_38);
    break;
  case '\x02':
    local_48 = (longdouble)*(long *)in_RSI / *local_18;
    numeric<long_double>(in_RDI,&local_48);
    break;
  case '\x03':
    if (*(long *)in_RSI % *(long *)local_18 == 0) {
      local_60 = *(long *)in_RSI / *(long *)local_18;
      numeric<long_long>(in_RDI,&local_60);
    }
    else {
      local_58 = (longdouble)*(long *)in_RSI / (longdouble)*(long *)local_18;
      numeric<long_double>(in_RDI,&local_58);
    }
  }
  return in_RDI;
}

Assistant:

numeric operator/(const numeric &rhs) const noexcept
		{
			switch (get_composite_type(type, rhs.type)) {
			default:
			case 0b00:
				return data._num / rhs.data._num;
			case 0b01:
				return data._num / rhs.data._int;
			case 0b10:
				return data._int / rhs.data._num;
			case 0b11:
				if (data._int % rhs.data._int != 0)
					return static_cast<numeric_float>(data._int) / rhs.data._int;
				else
					return data._int / rhs.data._int;
			}
		}